

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_psk_key_exchange_modes_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  undefined1 local_90 [8];
  CBB ke_modes;
  CBB contents;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if (hs->max_version < 0x304) {
    hs_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator!=(&hs->pake_prover,(nullptr_t)0x0);
    if (bVar1) {
      hs_local._7_1_ = true;
    }
    else {
      iVar2 = CBB_add_u16(out_compressible,0x2d);
      if ((((iVar2 != 0) &&
           (iVar2 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)((long)&ke_modes.u + 0x18)),
           iVar2 != 0)) &&
          (iVar2 = CBB_add_u8_length_prefixed((CBB *)((long)&ke_modes.u + 0x18),(CBB *)local_90),
          iVar2 != 0)) && (iVar2 = CBB_add_u8((CBB *)local_90,'\x01'), iVar2 != 0)) {
        iVar2 = CBB_flush(out_compressible);
        return iVar2 != 0;
      }
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_psk_key_exchange_modes_add_clienthello(
    const SSL_HANDSHAKE *hs, CBB *out, CBB *out_compressible,
    ssl_client_hello_type_t type) {
  if (hs->max_version < TLS1_3_VERSION) {
    return true;
  }
  // We do not support resumption with PAKEs, so do not offer any PSK key
  // exchange modes, to signal the server not to send a ticket.
  if (hs->pake_prover != nullptr) {
    return true;
  }

  CBB contents, ke_modes;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_psk_key_exchange_modes) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u8_length_prefixed(&contents, &ke_modes) ||
      !CBB_add_u8(&ke_modes, SSL_PSK_DHE_KE)) {
    return false;
  }

  return CBB_flush(out_compressible);
}